

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void trb_print_family_tree(trt_wrapper wr,trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  trt_parent_cache tVar1;
  trt_parent_cache ca_00;
  trt_parent_cache tVar2;
  ly_bool lVar3;
  void *pvVar4;
  trt_node local_160;
  trt_node local_100;
  undefined4 local_a0;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined8 local_98;
  uint32_t local_8c;
  undefined1 local_88 [4];
  uint32_t max_gap_before_type;
  trt_node node;
  trt_parent_cache ca;
  trt_tree_ctx *tc_local;
  trt_printer_ctx *pc_local;
  
  pvVar4 = tro_tree_ctx_get_node(tc);
  if (pvVar4 != (void *)0x0) {
    local_a0 = 0;
    uStack_9c = 4;
    uStack_9a = 1;
    local_98 = 0;
    node.last_one = '\0';
    node._89_5_ = 0x4000000;
    node._94_2_ = 1;
    local_8c = trb_try_unified_indent((trt_parent_cache)ZEXT816(0x1000400000000),pc,tc);
    if (((tc->lysc_tree == '\0') && (tc->section == TRD_SECT_GROUPING)) &&
       (tc->tpn == tc->pn->parent)) {
      node._94_2_ = 0;
    }
    tVar1.lys_config = node._94_2_;
    tVar1._0_6_ = node._88_6_;
    tVar1.last_list = (lysp_node_list *)0x0;
    (*(pc->fp).modify.first_sibling)(&local_100,tVar1,tc);
    memcpy(local_88,&local_100,0x60);
    while (lVar3 = trp_node_is_empty((trt_node *)local_88), lVar3 == '\0') {
      ly_print_(pc->out,"\n");
      ca_00.lys_config = node._94_2_;
      ca_00._0_6_ = node._88_6_;
      ca_00.last_list = (lysp_node_list *)0x0;
      trb_print_subtree_nodes((trt_node *)local_88,local_8c,wr,ca_00,pc,tc);
      tVar2.lys_config = node._94_2_;
      tVar2._0_6_ = node._88_6_;
      tVar2.last_list = (lysp_node_list *)0x0;
      (*(pc->fp).modify.next_sibling)(&local_160,tVar2,tc);
      memcpy(local_88,&local_160,0x60);
    }
  }
  return;
}

Assistant:

static void
trb_print_family_tree(struct trt_wrapper wr, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    struct trt_parent_cache ca;
    struct trt_node node;
    uint32_t max_gap_before_type;

    if (!tro_tree_ctx_get_node(tc)) {
        return;
    }

    ca = TRP_EMPTY_PARENT_CACHE;
    max_gap_before_type = trb_try_unified_indent(ca, pc, tc);

    if (!tc->lysc_tree) {
        if ((tc->section == TRD_SECT_GROUPING) && (tc->tpn == tc->pn->parent)) {
            ca.lys_config = 0x0;
        }
    }

    for (node = pc->fp.modify.first_sibling(ca, tc);
            !trp_node_is_empty(&node);
            node = pc->fp.modify.next_sibling(ca, tc)) {
        ly_print_(pc->out, "\n");
        trb_print_subtree_nodes(&node, max_gap_before_type, wr, ca, pc, tc);
    }
}